

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_increment_topology(Executor *this)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffff0,in_RDI);
  in_RDI[4].super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)
       ((long)&(in_RDI[4].super___mutex_base._M_mutex.__data.__list.__prev)->__prev + 1);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12ca03);
  return;
}

Assistant:

inline void Executor::_increment_topology() {
#if __cplusplus >= TF_CPP20
  _num_topologies.fetch_add(1, std::memory_order_relaxed);
#else
  std::lock_guard<std::mutex> lock(_topology_mutex);
  ++_num_topologies;
#endif
}